

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  Scalar *pSVar6;
  uint v;
  long lVar7;
  long lVar8;
  uint i;
  long lVar9;
  long startCol;
  undefined1 auVar10 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [16];
  Matrix<double,__1,__1,_0,__1,__1> PI2;
  Matrix<double,__1,__1,_0,__1,__1> K2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow0;
  Matrix3xN e_bar;
  Matrix3xN temp;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1c00;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_1be8;
  variable_if_dynamic<long,__1> vStack_1be0;
  variable_if_dynamic<long,__1> vStack_1bd8;
  scalar_constant_op<double> sStack_1bd0;
  RhsNested pMStack_1bc8;
  Index IStack_1bc0;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_24,_false> local_1bb8;
  double local_1b88;
  Matrix<double,_1,_24,_1,_1,_24> local_1b80;
  Matrix<double,_1,_24,_1,_1,_24> local_1ac0;
  Matrix<double,_1,_24,_1,_1,_24> local_1a00;
  Matrix<double,_3,_24,_1,_3,_24> local_1940;
  PlainObjectBase<Eigen::Matrix<double,3,24,1,3,24>> local_1700 [192];
  Matrix<double,__1,__1,_0,__1,__1> local_1640 [8];
  Matrix<double,__1,__1,_0,__1,__1> local_1580 [8];
  Product<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_Eigen::Matrix<double,_1,_24,_1,_1,_24>,_0>
  local_14c0;
  double local_1480;
  RhsNested local_1478;
  StorageBaseType local_2c0 [656];
  
  CalcCoordMatrix(this,(Matrix3xN *)&local_1940);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_2c0);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = Kfactor;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = Rfactor;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_Alpha;
  auVar10 = vfmadd132sd_fma(auVar11,auVar3,auVar10);
  local_1b80.super_PlainObjectBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>.m_storage.m_data.array
  [0] = auVar10._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                    *)&local_1a00,(double *)&local_1b80,(StorageBaseType *)&local_1940);
  local_1be8 = (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               (Kfactor * this->m_Alpha);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                    *)&local_1ac0,(double *)&local_1be8,local_2c0);
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
  m_value = (long)local_1a00.super_PlainObjectBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>.
                  m_storage.m_data.array[2];
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
  m_value = (long)local_1a00.super_PlainObjectBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>.
                  m_storage.m_data.array[3];
  local_1480 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>.m_storage.
               m_data.array[2];
  local_1478 = (RhsNested)
               local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>.m_storage.
               m_data.array[3];
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,24,1,3,24>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,24,1,3,24>const>const,Eigen::Matrix<double,3,24,1,3,24>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,24,1,3,24>const>const,Eigen::Matrix<double,3,24,1,3,24>const>const>>
            (local_1700,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_const_Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>_>
              *)&local_14c0);
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
  m_value = 0;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
  m_value = 0;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
       0x18;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
       (PointerType)local_1700;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
       (XprTypeNested)local_1700;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,1,24,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1a00,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1,_24,_false>_> *)
             &local_14c0);
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
       (PointerType)local_1640;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
  m_value = 1;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
  m_value = 0;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
       0x18;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
       (XprTypeNested)local_1700;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,1,24,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1ac0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1,_24,_false>_> *)
             &local_14c0);
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
       (PointerType)local_1580;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
  m_value = 2;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
  m_value = 0;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
       0x18;
  local_14c0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
       (XprTypeNested)local_1700;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,1,24,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1b80,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1,_24,_false>_> *)
             &local_14c0);
  local_1c00.m_storage.m_cols = 0;
  local_1c00.m_storage.m_data = (double *)0x0;
  local_1c00.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_1c00,9,0x240);
  lVar9 = 0;
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_1be8,&local_1940
               ,0,lVar7);
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)pMStack_1bc8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
         IStack_1bc0;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
         (PointerType)local_1be8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>._8_8_ =
         vStack_1be0.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)vStack_1bd8.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)sStack_1bd0.m_other;
    local_14c0.m_rhs = &local_1a00;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_24,_false>::Block
              (&local_1bb8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1c00,0,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,24,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Matrix<double,1,24,1,1,24>,0>>
              (&local_1bb8,&local_14c0);
    Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_1be8,&local_1940
               ,0,lVar7);
    local_14c0.m_rhs = &local_1ac0;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)pMStack_1bc8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
         IStack_1bc0;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
         (PointerType)local_1be8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>._8_8_ =
         vStack_1be0.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)vStack_1bd8.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)sStack_1bd0.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_24,_false>::Block
              (&local_1bb8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1c00,3,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,24,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Matrix<double,1,24,1,1,24>,0>>
              (&local_1bb8,&local_14c0);
    Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_1be8,&local_1940
               ,0,lVar7);
    local_14c0.m_rhs = &local_1b80;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)pMStack_1bc8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_outerStride =
         IStack_1bc0;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>.m_data =
         (PointerType)local_1be8;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false>,_0>._8_8_ =
         vStack_1be0.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)vStack_1bd8.m_value;
    local_14c0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)sStack_1bd0.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_24,_false>::Block
              (&local_1bb8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1c00,6,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,24,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Matrix<double,1,24,1,1,24>,0>>
              (&local_1bb8,&local_14c0);
    lVar9 = lVar9 + 0x18;
  }
  local_1be8 = &local_1c00;
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
             *)&local_14c0,(Lhs *)&local_1be8,&this->m_O2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1bb8,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_14c0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    lVar8 = lVar7 * 3;
    startCol = lVar7;
    for (lVar9 = 2; lVar9 != 0x4a; lVar9 = lVar9 + 3) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_1bb8,0,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)&local_1be8,H,lVar8,lVar9 + -2);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)&local_1be8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_1bb8,3,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)&local_1be8,H,lVar8,lVar9 + -1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)&local_1be8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_1bb8,6,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)&local_1be8,H,lVar8,lVar9);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)&local_1be8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_14c0);
      startCol = startCol + 0x18;
    }
  }
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = Kfactor;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar4,auVar2);
  local_1b88 = (double)vmovlpd_avx(auVar10);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&local_1be8,&local_1b88,(StorageBaseType *)&this->m_K13Compact);
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>> *)&local_14c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_1be8);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    lVar9 = 0;
    for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                          &local_14c0,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3,lVar9);
      *pSVar6 = dVar1 + *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                          &local_14c0,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3 + 1,lVar9 + 1);
      *pSVar6 = dVar1 + *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                          &local_14c0,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3 + 2,lVar9 + 2);
      lVar9 = lVar9 + 3;
      *pSVar6 = dVar1 + *pSVar6;
    }
  }
  Eigen::internal::handmade_aligned_free
            (local_1bb8.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_24,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_24,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_24,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_24,_false>,_0>.
             m_data);
  Eigen::internal::handmade_aligned_free(local_1c00.m_storage.m_data);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> PI2;
    PI2.resize(9, NSF * NSF);

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}